

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

int __thiscall
ExtraData::parseClipboardData
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int pos)

{
  int iVar1;
  ostream *poVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_20;
  int local_1c;
  int len;
  int pos_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *val_local;
  ExtraData *this_local;
  
  local_1c = pos;
  _len = val;
  val_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"                ClipboardData:      ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,val);
  iVar1 = Utils::lenFourBytesFromPos(&local_38,local_1c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  local_20 = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Size:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," bytes");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "The total size in bytes of the Format and Data fields, not including padding (if any)."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Format:        ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,val);
  iVar1 = Utils::lenFourBytesFromPos(&local_60,local_1c + 4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "An application-specific identifier for the format of the data in the Data field."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
  std::operator<<((ostream *)&std::cout,"                     Data:          ");
  Utils::print_vec_unicode_from_to(val,local_1c + 8,local_1c + local_20 + -8);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return local_20 + 4;
}

Assistant:

int ExtraData::parseClipboardData(std::vector<unsigned int> val, int pos) {
    cout << "                ClipboardData:      " << endl;
    int len = Utils::lenFourBytesFromPos(val, pos);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The total size in bytes of the Format and Data fields, not including padding (if any)." << endl;
    cout << "                     Format:        " << Utils::lenFourBytesFromPos(val, pos+4) << endl <<
         Utils::defaultOffsetDocInfo << "An application-specific identifier for the format of the data in the Data field." << endl;
    cout << "                     Data:          "; Utils::print_vec_unicode_from_to(val, pos+8, pos + len - 8);
    cout << Utils::defaultOffsetDocInfo << "MUST be an array of bytes, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}